

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O1

void __thiscall Future<void>::startProc(Future<void> *this,_func_void_void_ptr *proc,void *args)

{
  int iVar1;
  uint uVar2;
  ThreadPool *pTVar3;
  
  if (Private::_threadPool == (ThreadPool *)0x0) {
    do {
      iVar1 = Private::_threadPoolLock;
      LOCK();
      Private::_threadPoolLock = 1;
      UNLOCK();
    } while (iVar1 != 0);
    pTVar3 = (ThreadPool *)operator_new(0x248);
    uVar2 = System::getProcessorCount();
    Private::ThreadPool::ThreadPool(pTVar3,0,(ulong)uVar2,0x100);
    LOCK();
    UNLOCK();
    Private::_threadPoolLock = 0;
    Private::_threadPool = pTVar3;
  }
  pTVar3 = Private::_threadPool;
  join(this);
  this->_joinable = true;
  this->_aborting = false;
  Private::ThreadPool::run(pTVar3,proc,args);
  return;
}

Assistant:

void Future<void>::startProc(void (*proc)(void *), void *args)
{
  Private::ThreadPool *threadPool = Private::_threadPool;
  if (!threadPool)
  {
    while (Atomic::testAndSet(Private::_threadPoolLock) != 0)
      ;
    if (!(threadPool = Private::_threadPool))
    {
      threadPool = new Private::ThreadPool;
      Atomic::swap(Private::_threadPool, threadPool);
    }
    Private::_threadPoolLock = 0;
  }

  join();
  _joinable = true;
  _aborting = false;
  threadPool->run(proc, args);
}